

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O2

bool __thiscall
rlottie::internal::model::Rect::roundnessChanged(Rect *this,int prevFrame,int curFrame)

{
  bool bVar1;
  Property<float,_void> *this_00;
  
  this_00 = &this->mRound;
  if (this->mRoundedCorner != (RoundedCorner *)0x0) {
    this_00 = &this->mRoundedCorner->mRadius;
  }
  bVar1 = Property<float,_void>::changed(this_00,prevFrame,curFrame);
  return bVar1;
}

Assistant:

bool roundnessChanged(int prevFrame, int curFrame)
    {
        return mRoundedCorner ? mRoundedCorner->mRadius.changed(prevFrame, curFrame) :
                        mRound.changed(prevFrame, curFrame);
    }